

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::cert_compression_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  CBB algs;
  CBB contents;
  
  _Var1._M_head_impl =
       (hs->ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
  lVar2 = (long)((_Var1._M_head_impl)->cert_compression_algs).data_;
  sVar3 = *(size_t *)((long)&(_Var1._M_head_impl)->cert_compression_algs + 8);
  bVar4 = true;
  lVar6 = 0;
  lVar7 = lVar2;
  do {
    if (sVar3 * 0x18 - lVar6 == 0) {
      bVar8 = true;
      if (!bVar4) {
        iVar5 = CBB_flush(out_compressible);
        bVar8 = iVar5 != 0;
      }
      return bVar8;
    }
    if (*(long *)(lVar7 + 8) != 0) {
      if (bVar4) {
        iVar5 = CBB_add_u16(out_compressible,0x1b);
        if (iVar5 == 0) {
          return false;
        }
        iVar5 = CBB_add_u16_length_prefixed(out_compressible,&contents);
        if (iVar5 == 0) {
          return false;
        }
        iVar5 = CBB_add_u8_length_prefixed(&contents,&algs);
        if (iVar5 == 0) {
          return false;
        }
      }
      iVar5 = CBB_add_u16(&algs,*(uint16_t *)(lVar2 + 0x10 + lVar6));
      bVar4 = false;
      if (iVar5 == 0) {
        return false;
      }
    }
    lVar7 = lVar7 + 0x18;
    lVar6 = lVar6 + 0x18;
  } while( true );
}

Assistant:

static bool cert_compression_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                             CBB *out_compressible,
                                             ssl_client_hello_type_t type) {
  bool first = true;
  CBB contents, algs;

  for (const auto &alg : hs->ssl->ctx->cert_compression_algs) {
    if (alg.decompress == nullptr) {
      continue;
    }

    if (first &&
        (!CBB_add_u16(out_compressible, TLSEXT_TYPE_cert_compression) ||
         !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
         !CBB_add_u8_length_prefixed(&contents, &algs))) {
      return false;
    }
    first = false;
    if (!CBB_add_u16(&algs, alg.alg_id)) {
      return false;
    }
  }

  return first || CBB_flush(out_compressible);
}